

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O1

bool __thiscall helics::TimeDependencies::addDependency(TimeDependencies *this,GlobalFederateId gid)

{
  bool bVar1;
  DependencyInfo *pDVar2;
  iterator iVar3;
  difference_type __d;
  ulong uVar4;
  ulong uVar5;
  const_iterator __position;
  ulong uVar6;
  GlobalFederateId local_c;
  
  __position._M_current =
       (this->dependencies).
       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  pDVar2 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_c.gid = gid.gid;
  if (__position._M_current != pDVar2) {
    if (0 < (long)pDVar2 - (long)__position._M_current) {
      uVar6 = ((ulong)((long)pDVar2 - (long)__position._M_current) >> 3) * 0x2e8ba2e8ba2e8ba3;
      do {
        uVar4 = uVar6 >> 1;
        uVar5 = uVar4;
        if (__position._M_current[uVar4].fedID.gid < gid.gid) {
          uVar5 = ~uVar4 + uVar6;
          __position._M_current = __position._M_current + uVar4 + 1;
        }
        uVar6 = uVar5;
      } while (0 < (long)uVar5);
    }
    if (__position._M_current != pDVar2) {
      if (((__position._M_current)->fedID).gid != gid.gid) {
        iVar3 = std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
                _M_emplace_aux<helics::GlobalFederateId&>
                          ((vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>> *)
                           this,__position,&local_c);
        (iVar3._M_current)->dependency = true;
        return true;
      }
      bVar1 = (__position._M_current)->dependency;
      (__position._M_current)->dependency = true;
      if (((__position._M_current)->super_TimeData).next.internalTimeCode == 0x7fffffffffffffff) {
        ((__position._M_current)->super_TimeData).next.internalTimeCode = -1;
        ((__position._M_current)->super_TimeData).lastGrant.internalTimeCode = 0;
        ((__position._M_current)->super_TimeData).mTimeState = initialized;
        return true;
      }
      return (bool)(bVar1 ^ 1);
    }
  }
  std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
  emplace_back<helics::GlobalFederateId&>
            ((vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>> *)this,&local_c)
  ;
  (this->dependencies).
  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].dependency = true;
  return true;
}

Assistant:

bool TimeDependencies::addDependency(GlobalFederateId gid)

{
    if (dependencies.empty()) {
        dependencies.emplace_back(gid);
        dependencies.back().dependency = true;
        return true;
    }
    auto dep = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if (dep == dependencies.end()) {
        dependencies.emplace_back(gid);
        dependencies.back().dependency = true;
    } else {
        if (dep->fedID == gid) {
            auto rval = dep->dependency;
            dep->dependency = true;
            if (dep->next == Time::maxVal()) {
                dep->next = negEpsilon;
                dep->lastGrant = timeZero;
                dep->mTimeState = TimeState::initialized;
                return true;
            }
            // the dependency is already present
            return !rval;
        }
        auto dependencyIterator = dependencies.emplace(dep, gid);
        dependencyIterator->dependency = true;
    }
    return true;
}